

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

double __thiscall
NEST::NESTcalc::FanoER
          (NESTcalc *this,double density,double Nq_mean,double efield,
          vector<double,_std::allocator<double>_> *NRERWidthsParam)

{
  bool bVar1;
  const_reference pvVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  NESTcalc *local_40;
  double Fano;
  vector<double,_std::allocator<double>_> *NRERWidthsParam_local;
  double efield_local;
  double Nq_mean_local;
  double density_local;
  NESTcalc *this_local;
  
  bVar1 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  if (bVar1) {
    this_local = (NESTcalc *)0x3fbc8b4395810625;
  }
  else {
    dVar3 = pow(density,2.0);
    dVar4 = pow(density,3.0);
    local_40 = (NESTcalc *)(dVar4 * 0.0015957 + dVar3 * -0.0057042 + density * -0.029623 + 0.12707);
    bVar1 = VDetector::get_inGas(this->fdetector);
    if (!bVar1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,6);
      if (0.0 < *pvVar2 || *pvVar2 == 0.0) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,6);
        local_40 = (NESTcalc *)*pvVar2;
      }
      else {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,6);
        dVar3 = *pvVar2;
        dVar4 = sqrt(Nq_mean);
        dVar5 = pow(efield,0.5);
        local_40 = (NESTcalc *)(ABS(dVar3) * dVar4 * dVar5 + (double)local_40);
      }
    }
    this_local = local_40;
  }
  return (double)this_local;
}

Assistant:

double NESTcalc::FanoER(double density, double Nq_mean, double efield,
                        const std::vector<double> &NRERWidthsParam) {
  if (ValidityTests::nearlyEqual(ATOM_NUM, 18.))  // liquid argon
    return 0.1115;  // T&I. conflicting reports of .107 (Doke) & ~0.1 elsewhere
  double Fano =
      0.12707 - 0.029623 * density -  // Fano factor is  << 1
      0.0057042 *
          pow(density,
              2.) +  //~0.1 for GXe w/ formula from Bolotnikov et al. 1995
      0.0015957 *
          pow(density,
              3.);  // to get it to be ~0.03 for LXe (E Dahl Ph.D. thesis)
  if (!fdetector->get_inGas()) {
    if (NRERWidthsParam[6] < 0.)
      Fano += fabs(NRERWidthsParam[6]) * sqrt(Nq_mean) * pow(efield, 0.5);
    else
      Fano = NRERWidthsParam[6];
  }
  return Fano;
}